

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_dec_ref_pic_marking(h264_stream_t *h,bs_t *b)

{
  int iVar1;
  slice_header_t *psVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  
  uVar4 = b->bits_left - 1;
  iVar1 = h->nal->nal_unit_type;
  psVar2 = h->sh;
  b->bits_left = uVar4;
  pbVar9 = b->p;
  pbVar3 = b->end;
  if (iVar1 == 5) {
    uVar5 = 0;
    if (pbVar9 < pbVar3) {
      uVar5 = (uint)((*pbVar9 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      uVar4 = 8;
    }
    (psVar2->drpm).no_output_of_prior_pics_flag = uVar5;
    uVar4 = uVar4 - 1;
    b->bits_left = uVar4;
    uVar5 = 0;
    if (pbVar9 < pbVar3) {
      uVar5 = (uint)((*pbVar9 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      b->p = pbVar9 + 1;
      b->bits_left = 8;
    }
    (psVar2->drpm).long_term_reference_flag = uVar5;
  }
  else {
    uVar5 = 0;
    if (pbVar9 < pbVar3) {
      uVar5 = (uint)((*pbVar9 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
    }
    (psVar2->drpm).adaptive_ref_pic_marking_mode_flag = uVar5;
    if (uVar5 != 0) {
      lVar10 = -1;
      do {
        uVar4 = b->bits_left;
        uVar5 = 0xffffffff;
        iVar1 = -2;
        do {
          iVar11 = iVar1;
          uVar6 = uVar5;
          uVar4 = uVar4 - 1;
          b->bits_left = uVar4;
          bVar12 = true;
          if (pbVar9 < pbVar3) {
            bVar12 = (*pbVar9 >> (uVar4 & 0x1f) & 1) == 0;
          }
          if (uVar4 == 0) {
            pbVar9 = pbVar9 + 1;
            b->p = pbVar9;
            b->bits_left = 8;
            uVar4 = 8;
          }
          uVar5 = uVar6 + 1;
        } while (((bool)(bVar12 & uVar5 < 0x20)) && (iVar1 = iVar11 + 1, pbVar9 < pbVar3));
        uVar7 = 0;
        if (uVar5 != 0) {
          do {
            uVar4 = uVar4 - 1;
            b->bits_left = uVar4;
            uVar8 = 0;
            if (pbVar9 < pbVar3) {
              uVar8 = (uint)((*pbVar9 >> (uVar4 & 0x1f) & 1) != 0);
            }
            if (uVar4 == 0) {
              pbVar9 = pbVar9 + 1;
              b->p = pbVar9;
              b->bits_left = 8;
              uVar4 = 8;
            }
            uVar7 = uVar7 | uVar8 << ((byte)uVar6 & 0x1f);
            uVar6 = uVar6 - 1;
            iVar11 = iVar11 + -1;
          } while (iVar11 != -2);
        }
        uVar7 = ~(-1 << ((byte)uVar5 & 0x1f)) + uVar7;
        (psVar2->drpm).memory_management_control_operation[lVar10 + 1] = uVar7;
        if ((uVar7 | 2) == 3) {
          uVar4 = b->bits_left;
          uVar5 = 0xffffffff;
          iVar1 = -2;
          do {
            iVar11 = iVar1;
            uVar6 = uVar5;
            uVar4 = uVar4 - 1;
            b->bits_left = uVar4;
            bVar12 = true;
            if (pbVar9 < pbVar3) {
              bVar12 = (*pbVar9 >> (uVar4 & 0x1f) & 1) == 0;
            }
            if (uVar4 == 0) {
              pbVar9 = pbVar9 + 1;
              b->p = pbVar9;
              b->bits_left = 8;
              uVar4 = 8;
            }
            uVar5 = uVar6 + 1;
          } while (((bool)(bVar12 & uVar5 < 0x20)) && (iVar1 = iVar11 + 1, pbVar9 < pbVar3));
          uVar7 = 0;
          if (uVar5 != 0) {
            do {
              uVar4 = uVar4 - 1;
              b->bits_left = uVar4;
              uVar8 = 0;
              if (pbVar9 < pbVar3) {
                uVar8 = (uint)((*pbVar9 >> (uVar4 & 0x1f) & 1) != 0);
              }
              if (uVar4 == 0) {
                pbVar9 = pbVar9 + 1;
                b->p = pbVar9;
                b->bits_left = 8;
                uVar4 = 8;
              }
              uVar7 = uVar7 | uVar8 << ((byte)uVar6 & 0x1f);
              uVar6 = uVar6 - 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != -2);
          }
          (psVar2->drpm).difference_of_pic_nums_minus1[lVar10 + 1] =
               ~(-1 << ((byte)uVar5 & 0x1f)) + uVar7;
          uVar7 = (psVar2->drpm).memory_management_control_operation[lVar10 + 1];
        }
        if (uVar7 == 2) {
          uVar4 = b->bits_left;
          uVar5 = 0xffffffff;
          iVar1 = -2;
          do {
            iVar11 = iVar1;
            uVar6 = uVar5;
            uVar4 = uVar4 - 1;
            b->bits_left = uVar4;
            bVar12 = true;
            if (pbVar9 < pbVar3) {
              bVar12 = (*pbVar9 >> (uVar4 & 0x1f) & 1) == 0;
            }
            if (uVar4 == 0) {
              pbVar9 = pbVar9 + 1;
              b->p = pbVar9;
              b->bits_left = 8;
              uVar4 = 8;
            }
            uVar5 = uVar6 + 1;
          } while (((bool)(bVar12 & uVar5 < 0x20)) && (iVar1 = iVar11 + 1, pbVar9 < pbVar3));
          uVar7 = 0;
          if (uVar5 != 0) {
            do {
              uVar4 = uVar4 - 1;
              b->bits_left = uVar4;
              uVar8 = 0;
              if (pbVar9 < pbVar3) {
                uVar8 = (uint)((*pbVar9 >> (uVar4 & 0x1f) & 1) != 0);
              }
              if (uVar4 == 0) {
                pbVar9 = pbVar9 + 1;
                b->p = pbVar9;
                b->bits_left = 8;
                uVar4 = 8;
              }
              uVar7 = uVar7 | uVar8 << ((byte)uVar6 & 0x1f);
              uVar6 = uVar6 - 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != -2);
          }
          (psVar2->drpm).long_term_pic_num[lVar10 + 1] = ~(-1 << ((byte)uVar5 & 0x1f)) + uVar7;
          uVar7 = (psVar2->drpm).memory_management_control_operation[lVar10 + 1];
        }
        if ((uVar7 == 6) || (uVar7 == 3)) {
          uVar4 = b->bits_left;
          uVar5 = 0xffffffff;
          iVar1 = -2;
          do {
            iVar11 = iVar1;
            uVar6 = uVar5;
            uVar4 = uVar4 - 1;
            b->bits_left = uVar4;
            bVar12 = true;
            if (pbVar9 < pbVar3) {
              bVar12 = (*pbVar9 >> (uVar4 & 0x1f) & 1) == 0;
            }
            if (uVar4 == 0) {
              pbVar9 = pbVar9 + 1;
              b->p = pbVar9;
              b->bits_left = 8;
              uVar4 = 8;
            }
            uVar5 = uVar6 + 1;
          } while (((bool)(bVar12 & uVar5 < 0x20)) && (iVar1 = iVar11 + 1, pbVar9 < pbVar3));
          uVar7 = 0;
          if (uVar5 != 0) {
            do {
              uVar4 = uVar4 - 1;
              b->bits_left = uVar4;
              uVar8 = 0;
              if (pbVar9 < pbVar3) {
                uVar8 = (uint)((*pbVar9 >> (uVar4 & 0x1f) & 1) != 0);
              }
              if (uVar4 == 0) {
                pbVar9 = pbVar9 + 1;
                b->p = pbVar9;
                b->bits_left = 8;
                uVar4 = 8;
              }
              uVar7 = uVar7 | uVar8 << ((byte)uVar6 & 0x1f);
              uVar6 = uVar6 - 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != -2);
          }
          (psVar2->drpm).long_term_frame_idx[lVar10 + 1] = ~(-1 << ((byte)uVar5 & 0x1f)) + uVar7;
          uVar7 = (psVar2->drpm).memory_management_control_operation[lVar10 + 1];
        }
        if (uVar7 == 4) {
          uVar4 = b->bits_left;
          uVar5 = 0xffffffff;
          iVar1 = -2;
          do {
            iVar11 = iVar1;
            uVar6 = uVar5;
            uVar4 = uVar4 - 1;
            b->bits_left = uVar4;
            bVar12 = true;
            if (pbVar9 < pbVar3) {
              bVar12 = (*pbVar9 >> (uVar4 & 0x1f) & 1) == 0;
            }
            if (uVar4 == 0) {
              pbVar9 = pbVar9 + 1;
              b->p = pbVar9;
              b->bits_left = 8;
              uVar4 = 8;
            }
            uVar5 = uVar6 + 1;
          } while (((bool)(bVar12 & uVar5 < 0x20)) && (iVar1 = iVar11 + 1, pbVar9 < pbVar3));
          uVar7 = 0;
          if (uVar5 != 0) {
            do {
              uVar4 = uVar4 - 1;
              b->bits_left = uVar4;
              uVar8 = 0;
              if (pbVar9 < pbVar3) {
                uVar8 = (uint)((*pbVar9 >> (uVar4 & 0x1f) & 1) != 0);
              }
              if (uVar4 == 0) {
                pbVar9 = pbVar9 + 1;
                b->p = pbVar9;
                b->bits_left = 8;
                uVar4 = 8;
              }
              uVar7 = uVar7 | uVar8 << ((byte)uVar6 & 0x1f);
              uVar6 = uVar6 - 1;
              iVar11 = iVar11 + -1;
            } while (iVar11 != -2);
          }
          (psVar2->drpm).max_long_term_frame_idx_plus1[lVar10 + 1] =
               ~(-1 << ((byte)uVar5 & 0x1f)) + uVar7;
          uVar7 = (psVar2->drpm).memory_management_control_operation[lVar10 + 1];
        }
      } while ((uVar7 != 0) && (lVar10 = lVar10 + 1, pbVar9 < pbVar3));
    }
  }
  return;
}

Assistant:

void read_dec_ref_pic_marking(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    // FIXME should be an array

    if( h->nal->nal_unit_type == 5 )
    {
        sh->drpm.no_output_of_prior_pics_flag = bs_read_u1(b);
        sh->drpm.long_term_reference_flag = bs_read_u1(b);
    }
    else
    {
        sh->drpm.adaptive_ref_pic_marking_mode_flag = bs_read_u1(b);
        if( sh->drpm.adaptive_ref_pic_marking_mode_flag )
        {
            int n = -1;
            do
            {
                n++;
                sh->drpm.memory_management_control_operation[ n ] = bs_read_ue(b);
                if( sh->drpm.memory_management_control_operation[ n ] == 1 ||
                    sh->drpm.memory_management_control_operation[ n ] == 3 )
                {
                    sh->drpm.difference_of_pic_nums_minus1[ n ] = bs_read_ue(b);
                }
                if(sh->drpm.memory_management_control_operation[ n ] == 2 )
                {
                    sh->drpm.long_term_pic_num[ n ] = bs_read_ue(b);
                }
                if( sh->drpm.memory_management_control_operation[ n ] == 3 ||
                    sh->drpm.memory_management_control_operation[ n ] == 6 )
                {
                    sh->drpm.long_term_frame_idx[ n ] = bs_read_ue(b);
                }
                if( sh->drpm.memory_management_control_operation[ n ] == 4 )
                {
                    sh->drpm.max_long_term_frame_idx_plus1[ n ] = bs_read_ue(b);
                }
            } while( sh->drpm.memory_management_control_operation[ n ] != 0 && ! bs_eof(b) );
        }
    }
}